

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O1

bool __thiscall Clasp::SatBuilder::markAssigned(SatBuilder *this)

{
  byte *pbVar1;
  SharedContext *this_00;
  Solver *pSVar2;
  bool bVar3;
  uint uVar4;
  
  this_00 = (this->super_ProgramBuilder).ctx_;
  bVar3 = true;
  if (this->pos_ != ((*(this_00->solvers_).ebo_.buf)->assign_).trail.ebo_.size) {
    bVar3 = SharedContext::ok(this_00);
    if (bVar3) {
      bVar3 = Solver::propagate(*(((this->super_ProgramBuilder).ctx_)->solvers_).ebo_.buf);
    }
    else {
      bVar3 = false;
    }
    pSVar2 = *(((this->super_ProgramBuilder).ctx_)->solvers_).ebo_.buf;
    uVar4 = this->pos_;
    while (uVar4 < (pSVar2->assign_).trail.ebo_.size) {
      uVar4 = (pSVar2->assign_).trail.ebo_.buf[uVar4].rep_;
      pbVar1 = (this->varState_).ebo_.buf + (uVar4 >> 2);
      *pbVar1 = *pbVar1 | ((uVar4 & 2) == 0) + 1U;
      uVar4 = this->pos_ + 1;
      this->pos_ = uVar4;
    }
  }
  return bVar3;
}

Assistant:

bool SatBuilder::markAssigned() {
	if (pos_ == ctx()->master()->trail().size()) { return true; }
	bool ok = ctx()->ok() && ctx()->master()->propagate();
	for (const LitVec& trail = ctx()->master()->trail(); pos_ < trail.size(); ++pos_) {
		markLit(~trail[pos_]);
	}
	return ok;
}